

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_0::createFences
               (DeviceInterface *deviceInterface,VkDevice device,bool signaled,deUint32 numFences,
               VkFence *fence)

{
  VkResult result;
  uint local_48;
  deUint32 ndx;
  VkFenceCreateFlags signalFlag;
  VkFenceCreateInfo fenceState;
  VkFence *fence_local;
  deUint32 numFences_local;
  bool signaled_local;
  VkDevice device_local;
  DeviceInterface *deviceInterface_local;
  
  fenceState._16_8_ = fence;
  ::deMemset(&ndx,0xcd,0x18);
  ndx = 8;
  fenceState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  fenceState._4_4_ = 0;
  fenceState.pNext._0_4_ = (uint)signaled;
  for (local_48 = 0; local_48 < numFences; local_48 = local_48 + 1) {
    result = (*deviceInterface->_vptr_DeviceInterface[0x12])
                       (deviceInterface,device,&ndx,0,fenceState._16_8_ + (ulong)local_48 * 8);
    ::vk::checkResult(result,
                      "deviceInterface.createFence(device, &fenceState, DE_NULL, &fence[ndx])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0x1b1);
  }
  return;
}

Assistant:

void createFences (const DeviceInterface& deviceInterface, VkDevice device, bool signaled, deUint32 numFences, VkFence* fence)
{
	VkFenceCreateInfo		fenceState;
	VkFenceCreateFlags		signalFlag = signaled ? VK_FENCE_CREATE_SIGNALED_BIT : 0;

	deMemset(&fenceState, 0xcd, sizeof(fenceState));
	fenceState.sType		= VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
	fenceState.pNext		= DE_NULL;
	fenceState.flags		= signalFlag;

	for (deUint32 ndx = 0; ndx < numFences; ndx++)
		VK_CHECK(deviceInterface.createFence(device, &fenceState, DE_NULL, &fence[ndx]));
}